

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QAbstractItemDelegate * __thiscall
QAbstractItemView::itemDelegateForRow(QAbstractItemView *this,int row)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemDelegate *pQVar1;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  nullptr_t in_stack_ffffffffffffff98;
  QPointer<QAbstractItemDelegate> *in_stack_ffffffffffffffb0;
  int *key;
  int local_30 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractItemView *)0x801ca9);
  key = local_30;
  QPointer<QAbstractItemDelegate>::QPointer
            ((QPointer<QAbstractItemDelegate> *)&this_00->rowDelegates,in_stack_ffffffffffffff98);
  QMap<int,_QPointer<QAbstractItemDelegate>_>::value
            ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)this_00,key,in_stack_ffffffffffffffb0);
  pQVar1 = ::QPointer::operator_cast_to_QAbstractItemDelegate_
                     ((QPointer<QAbstractItemDelegate> *)0x801cf9);
  QPointer<QAbstractItemDelegate>::~QPointer((QPointer<QAbstractItemDelegate> *)0x801d08);
  QPointer<QAbstractItemDelegate>::~QPointer((QPointer<QAbstractItemDelegate> *)0x801d12);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractItemDelegate *QAbstractItemView::itemDelegateForRow(int row) const
{
    Q_D(const QAbstractItemView);
    return d->rowDelegates.value(row, nullptr);
}